

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyle::~IfcSurfaceStyle(IfcSurfaceStyle *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcPresentationStyle).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[7];
  *(void **)&(this->super_IfcPresentationStyle).field_0x38 = vtt[8];
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector(&(this->Styles).
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           );
  std::__cxx11::string::~string((string *)&(this->super_IfcPresentationStyle).field_0x48);
  IfcPresentationStyle::~IfcPresentationStyle(&this->super_IfcPresentationStyle,vtt + 1);
  return;
}

Assistant:

IfcSurfaceStyle() : Object("IfcSurfaceStyle") {}